

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O2

int __thiscall
ncnn::Layer::forward
          (Layer *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  undefined8 *puVar2;
  int *piVar3;
  long *plVar4;
  int iVar5;
  pointer pMVar6;
  long lVar7;
  void *in_R8;
  long lVar8;
  Mat local_78;
  
  if (this->support_inplace == true) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=(top_blobs,bottom_blobs);
    pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = -1;
    lVar8 = 0;
    do {
      lVar7 = lVar7 + 1;
      if ((int)(((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48) <= lVar7) {
        iVar5 = (*this->_vptr_Layer[8])(this,top_blobs,opt);
        return iVar5;
      }
      Mat::clone(&local_78,
                 (__fn *)((long)&((bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_start)->data + lVar8),
                 opt->blob_allocator,0x48,in_R8);
      pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pMVar1 = (Mat *)((long)&pMVar6->data + lVar8);
      if (pMVar1 != &local_78) {
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + 1;
          UNLOCK();
        }
        piVar3 = *(int **)((long)&pMVar6->refcount + lVar8);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            plVar4 = *(long **)((long)&pMVar6->allocator + lVar8);
            if (plVar4 == (long *)0x0) {
              free(*(void **)((long)&pMVar6->data + lVar8));
            }
            else {
              (**(code **)(*plVar4 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&pMVar6->cstep + lVar8) = 0;
        *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        puVar2 = (undefined8 *)((long)&pMVar6->dims + lVar8);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined4 *)((long)&pMVar6->c + lVar8) = 0;
        *(void **)((long)&pMVar6->data + lVar8) = local_78.data;
        *(int **)((long)&pMVar6->refcount + lVar8) = local_78.refcount;
        *(size_t *)((long)&pMVar6->elemsize + lVar8) = local_78.elemsize;
        *(int *)((long)&pMVar6->elempack + lVar8) = local_78.elempack;
        *(Allocator **)((long)&pMVar6->allocator + lVar8) = local_78.allocator;
        piVar3 = (int *)((long)&pMVar6->dims + lVar8);
        *piVar3 = local_78.dims;
        piVar3[1] = local_78.w;
        piVar3[2] = local_78.h;
        piVar3[3] = local_78.d;
        *(int *)((long)&pMVar6->c + lVar8) = local_78.c;
        *(size_t *)((long)&pMVar6->cstep + lVar8) = local_78.cstep;
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            free(local_78.data);
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while ((*(long *)((long)&pMVar6->data + lVar8) != 0) &&
            (piVar3 = (int *)((long)&pMVar6->c + lVar8),
            plVar4 = (long *)((long)&pMVar6->cstep + lVar8), lVar8 = lVar8 + 0x48,
            (long)*piVar3 * *plVar4 != 0));
    iVar5 = -100;
  }
  else {
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int Layer::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blobs = bottom_blobs;
    for (int i = 0; i < (int)top_blobs.size(); i++)
    {
        top_blobs[i] = bottom_blobs[i].clone(opt.blob_allocator);
        if (top_blobs[i].empty())
            return -100;
    }

    return forward_inplace(top_blobs, opt);
}